

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_clock.c
# Opt level: O3

char * oonf_clock_toClockString(isonumber_str *buf,uint64_t clk)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  uVar2 = clk / 1000;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  snprintf(buf->buf,0x30,"%lu:%02lu:%02lu.%03lu",clk / 3600000,
           (ulong)(((int)uVar2 + (SUB164(auVar1 * ZEXT816(0x91a2b3c4d5e6f9),8) >> 3) * -0xe10) *
                   0x889 >> 0x11),uVar2 % 0x3c,clk % 1000);
  return buf->buf;
}

Assistant:

const char *
oonf_clock_toClockString(struct isonumber_str *buf, uint64_t clk) {
  uint64_t msec = clk % MSEC_PER_SEC;
  uint64_t sec = clk / MSEC_PER_SEC;

  snprintf(buf->buf, sizeof(*buf), "%" PRIu64 ":%02" PRIu64 ":%02" PRIu64 ".%03" PRIu64 "", sec / 3600,
    (sec % 3600) / 60, (sec % 60), msec);

  return buf->buf;
}